

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  size_type *psVar1;
  ulong uVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  _Node *p_Var8;
  _Node **pp_Var9;
  char *pcVar10;
  char cVar11;
  ulong *puVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  *this_00;
  char *__s2;
  size_type sVar17;
  char *pcVar18;
  _Node *p_Var19;
  _Node **pp_Var20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pcVar10 = (name->_M_dataplus)._M_p;
  cVar11 = *pcVar10;
  if (cVar11 == '\0') {
    pcVar7 = (char *)0x0;
    __s2 = (char *)parent;
  }
  else {
    pcVar7 = (char *)0x0;
    pcVar13 = pcVar10;
    do {
      pcVar13 = pcVar13 + 1;
      __s2 = (char *)((long)pcVar7 * 5);
      pcVar7 = __s2 + cVar11;
      cVar11 = *pcVar13;
    } while (cVar11 != '\0');
  }
  uVar16 = (this->symbols_by_parent_).
           super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
           .
           super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
           .
           super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
           ._M_bucket_count;
  uVar14 = (ulong)(pcVar7 + (long)parent * 0xffff) % uVar16;
  p_Var8 = (this->symbols_by_parent_).
           super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
           .
           super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
           .
           super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
           ._M_buckets[uVar14];
  do {
    if (p_Var8 == (_Node *)0x0) {
      bVar5 = true;
LAB_001d82c0:
      if (bVar5) {
        uVar2 = (this->symbols_by_parent_).
                super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_element_count;
        if ((this->symbols_by_parent_).
            super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_rehash_policy._M_next_resize < uVar2 + 1) {
          fVar22 = (this->symbols_by_parent_).
                   super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                   .
                   super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                   .
                   super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   ._M_rehash_policy._M_max_load_factor;
          fVar23 = ((float)uVar2 + 1.0) / fVar22;
          fVar21 = (float)uVar16;
          bVar4 = fVar21 < fVar23;
          if (fVar23 <= fVar21) {
            this_00 = (_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                       *)0x0;
          }
          else {
            fVar21 = fVar21 * (this->symbols_by_parent_).
                              super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                              .
                              super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                              .
                              super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                              ._M_rehash_policy._M_growth_factor;
            if (fVar21 <= fVar23) {
              fVar21 = fVar23;
            }
            fVar21 = ceilf(fVar21);
            pcVar13 = (char *)0x12f;
            puVar12 = &std::tr1::__detail::__prime_list;
            do {
              __s2 = (char *)((ulong)pcVar13 >> 1);
              pcVar18 = pcVar13 + ~(ulong)__s2;
              pcVar13 = __s2;
              if (puVar12[(long)__s2] <
                  (ulong)((long)(fVar21 - 9.223372e+18) & (long)fVar21 >> 0x3f | (long)fVar21)) {
                puVar12 = puVar12 + (long)__s2 + 1;
                pcVar13 = pcVar18;
              }
            } while (0 < (long)pcVar13);
            this_00 = (_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                       *)*puVar12;
            fVar21 = (float)this_00;
          }
          fVar22 = ceilf(fVar22 * fVar21);
          (this->symbols_by_parent_).
          super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_rehash_policy._M_next_resize =
               (long)(fVar22 - 9.223372e+18) & (long)fVar22 >> 0x3f | (long)fVar22;
        }
        else {
          bVar4 = false;
          this_00 = (_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                     *)0x0;
        }
        p_Var8 = (_Node *)operator_new(0x28);
        (p_Var8->_M_v).first.first = parent;
        (p_Var8->_M_v).first.second = pcVar10;
        (p_Var8->_M_v).second.type = symbol.type;
        (p_Var8->_M_v).second.field_1 = symbol.field_1;
        p_Var8->_M_next =
             (_Hash_node<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
              *)0x0;
        if (bVar4) {
          uVar14 = (ulong)(pcVar7 + (long)parent * 0xffff) % (ulong)this_00;
          pp_Var9 = std::tr1::
                    _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                    ::_M_allocate_buckets(this_00,(size_type)__s2);
          sVar3 = (this->symbols_by_parent_).
                  super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                  .
                  super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                  .
                  super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                  ._M_bucket_count;
          if (sVar3 != 0) {
            sVar17 = 0;
            do {
              pp_Var20 = (this->symbols_by_parent_).
                         super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                         .
                         super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                         .
                         super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                         ._M_buckets;
              p_Var19 = pp_Var20[sVar17];
              if (p_Var19 != (_Node *)0x0) {
                pp_Var20 = pp_Var20 + sVar17;
                do {
                  pcVar10 = (p_Var19->_M_v).first.second;
                  cVar11 = *pcVar10;
                  if (cVar11 == '\0') {
                    lVar15 = 0;
                  }
                  else {
                    lVar15 = 0;
                    do {
                      pcVar10 = pcVar10 + 1;
                      lVar15 = (long)cVar11 + lVar15 * 5;
                      cVar11 = *pcVar10;
                    } while (cVar11 != '\0');
                  }
                  uVar16 = (ulong)((long)(p_Var19->_M_v).first.first * 0xffff + lVar15) %
                           (ulong)this_00;
                  *pp_Var20 = p_Var19->_M_next;
                  p_Var19->_M_next = pp_Var9[uVar16];
                  pp_Var9[uVar16] = p_Var19;
                  pp_Var20 = (this->symbols_by_parent_).
                             super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                             .
                             super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                             .
                             super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                             ._M_buckets + sVar17;
                  p_Var19 = *pp_Var20;
                } while (p_Var19 != (_Node *)0x0);
              }
              sVar17 = sVar17 + 1;
            } while (sVar17 != sVar3);
          }
          operator_delete((this->symbols_by_parent_).
                          super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                          .
                          super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                          .
                          super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                          ._M_buckets,sVar3 * 8 + 8);
          (this->symbols_by_parent_).
          super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count = (size_type)this_00;
          (this->symbols_by_parent_).
          super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_buckets = pp_Var9;
        }
        pp_Var9 = (this->symbols_by_parent_).
                  super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                  .
                  super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                  .
                  super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                  ._M_buckets;
        p_Var8->_M_next = pp_Var9[uVar14];
        pp_Var9[uVar14] = p_Var8;
        psVar1 = &(this->symbols_by_parent_).
                  super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                  .
                  super___unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                  .
                  super__Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                  ._M_element_count;
        *psVar1 = *psVar1 + 1;
      }
      return bVar5;
    }
    if ((p_Var8->_M_v).first.first == parent) {
      __s2 = (p_Var8->_M_v).first.second;
      iVar6 = strcmp(pcVar10,__s2);
      if (iVar6 == 0) {
        bVar5 = false;
        goto LAB_001d82c0;
      }
    }
    p_Var8 = p_Var8->_M_next;
  } while( true );
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(
    const void* parent, const string& name, Symbol symbol) {
  PointerStringPair by_parent_key(parent, name.c_str());
  return InsertIfNotPresent(&symbols_by_parent_, by_parent_key, symbol);
}